

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O2

void __thiscall GrcManager::DetermineTableVersion(GrcManager *this)

{
  int fxdSilfVersion;
  bool bVar1;
  string *this_00;
  allocator local_16c;
  allocator local_16b;
  allocator local_16a;
  bool fFixPassConstraints;
  int fxdVersionNeeded;
  int fxdCompilerVersionNeeded;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  fFixPassConstraints = true;
  fxdSilfVersion = this->m_fxdSilfTableVersion;
  SetCompilerVersionFor(this,fxdSilfVersion);
  fxdCompilerVersionNeeded = this->m_fxdCompilerVersion;
  bVar1 = CompatibleWithVersion
                    (this,fxdSilfVersion,&fxdVersionNeeded,&fxdCompilerVersionNeeded,
                     &fFixPassConstraints);
  if (bVar1) {
    if (fxdVersionNeeded <= fxdSilfVersion) {
      return;
    }
  }
  else {
    if ((0x30000 < fxdVersionNeeded & fxdSilfVersion < 0x30001 & fFixPassConstraints) == 1) {
      if (this->m_fUserSpecifiedVersion != false) {
        GdlRenderer::MovePassConstraintsToRules(this->m_prndr,fxdSilfVersion);
        return;
      }
      std::__cxx11::string::string((string *)&local_c0,"Version ",&local_16a);
      VersionString_abi_cxx11_(&local_e0,fxdSilfVersion);
      std::__cxx11::string::string
                ((string *)&local_100,
                 " of the Silf table is inadequate to handle pass constraints; version ",&local_16b)
      ;
      VersionString_abi_cxx11_(&local_40,fxdVersionNeeded);
      std::__cxx11::string::string((string *)&local_60," will be generated.",&local_16c);
      GrcErrorList::AddWarning
                (&g_errorList,0xdad,(GdlObject *)0x0,&local_c0,&local_e0,&local_100,&local_40,
                 &local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_e0);
      this_00 = &local_c0;
    }
    else {
      if (this->m_fUserSpecifiedVersion == false) goto LAB_00128afa;
      std::__cxx11::string::string((string *)&local_120,"Version ",&local_16a);
      VersionString_abi_cxx11_(&local_140,fxdSilfVersion);
      std::__cxx11::string::string
                ((string *)&local_160,
                 " of the Silf table is inadequate for your specification; version ",&local_16b);
      VersionString_abi_cxx11_(&local_80,fxdVersionNeeded);
      std::__cxx11::string::string((string *)&local_a0," will be generated instead.",&local_16c);
      GrcErrorList::AddWarning
                (&g_errorList,0xdad,(GdlObject *)0x0,&local_120,&local_140,&local_160,&local_80,
                 &local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_140);
      this_00 = &local_120;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
LAB_00128afa:
  this->m_fxdSilfTableVersion = fxdVersionNeeded;
  return;
}

Assistant:

void GrcManager::DetermineTableVersion()
{
	int fxdVersionNeeded;
	bool fFixPassConstraints = true;	// remains true if the only thing that is incompatible are
										// the pass constraints
	int fxdRequested = SilfTableVersion();
	SetCompilerVersionFor(fxdRequested);
	int fxdCompilerVersionNeeded = m_fxdCompilerVersion;
	if (!CompatibleWithVersion(fxdRequested, &fxdVersionNeeded, &fxdCompilerVersionNeeded,
			&fFixPassConstraints))
	{
		if (fFixPassConstraints && fxdRequested <= 0x00030000 && fxdVersionNeeded > 0x00030000)
		{
			if (UserSpecifiedVersion())
			{
				// Converting pass constraints to rule constraints should take care of the
				// incompatibility.
				m_prndr->MovePassConstraintsToRules(fxdRequested);
			}
			else
			{
				g_errorList.AddWarning(3501, NULL,
					"Version ",
					VersionString(fxdRequested),
					" of the Silf table is inadequate to handle pass constraints; version ",
					VersionString(fxdVersionNeeded),
					" will be generated.");
				FixSilfTableVersion(fxdVersionNeeded);
			}
		}
		else 
		{
			if (UserSpecifiedVersion())
			{
				g_errorList.AddWarning(3501, NULL,
					"Version ",
					VersionString(fxdRequested),
					" of the Silf table is inadequate for your specification; version ",
					VersionString(fxdVersionNeeded),
					" will be generated instead.");
			}
			FixSilfTableVersion(fxdVersionNeeded);
		}
		
	}
	else if (fxdVersionNeeded > fxdRequested)
	{
		// Eg, 2.0 -> 2.1
		FixSilfTableVersion(fxdVersionNeeded);
	}

}